

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t setup_sparse(archive_read_disk *a,archive_entry *entry)

{
  wchar_t wVar1;
  void *pvVar2;
  int64_t iVar3;
  int local_3c;
  int64_t iStack_38;
  wchar_t i;
  int64_t offset;
  int64_t length;
  tree *t;
  archive_entry *entry_local;
  archive_read_disk *a_local;
  
  length = (int64_t)a->tree;
  t = (tree *)entry;
  entry_local = (archive_entry *)a;
  wVar1 = archive_entry_sparse_reset(entry);
  *(wchar_t *)(length + 0x1e8) = wVar1;
  if (*(int *)(length + 0x1ec) < *(int *)(length + 0x1e8) + 1) {
    free(*(void **)(length + 0x1d8));
    *(int *)(length + 0x1ec) = *(int *)(length + 0x1e8) + 1;
    pvVar2 = malloc((long)*(int *)(length + 0x1ec) << 4);
    *(void **)(length + 0x1d8) = pvVar2;
    if (*(long *)(length + 0x1d8) == 0) {
      *(undefined4 *)(length + 0x1ec) = 0;
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate data");
      *(undefined4 *)((long)&entry_local->archive + 4) = 0x8000;
      return L'\xffffffe2';
    }
  }
  for (local_3c = 0; local_3c < *(int *)(length + 0x1e8); local_3c = local_3c + 1) {
    archive_entry_sparse_next((archive_entry *)t,&stack0xffffffffffffffc8,&offset);
    *(int64_t *)(*(long *)(length + 0x1d8) + (long)local_3c * 0x10 + 8) = iStack_38;
    *(int64_t *)(*(long *)(length + 0x1d8) + (long)local_3c * 0x10) = offset;
  }
  if (local_3c == 0) {
    *(undefined8 *)(*(long *)(length + 0x1d8) + 8) = 0;
    iVar3 = archive_entry_size((archive_entry *)t);
    **(int64_t **)(length + 0x1d8) = iVar3;
  }
  else {
    iVar3 = archive_entry_size((archive_entry *)t);
    *(int64_t *)(*(long *)(length + 0x1d8) + (long)local_3c * 0x10 + 8) = iVar3;
    *(undefined8 *)(*(long *)(length + 0x1d8) + (long)local_3c * 0x10) = 0;
  }
  *(undefined8 *)(length + 0x1e0) = *(undefined8 *)(length + 0x1d8);
  return L'\0';
}

Assistant:

static int
setup_sparse(struct archive_read_disk *a, struct archive_entry *entry)
{
	struct tree *t = a->tree;
	int64_t length, offset;
	int i;

	t->sparse_count = archive_entry_sparse_reset(entry);
	if (t->sparse_count+1 > t->sparse_list_size) {
		free(t->sparse_list);
		t->sparse_list_size = t->sparse_count + 1;
		t->sparse_list = malloc(sizeof(t->sparse_list[0]) *
		    t->sparse_list_size);
		if (t->sparse_list == NULL) {
			t->sparse_list_size = 0;
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate data");
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	for (i = 0; i < t->sparse_count; i++) {
		archive_entry_sparse_next(entry, &offset, &length);
		t->sparse_list[i].offset = offset;
		t->sparse_list[i].length = length;
	}
	if (i == 0) {
		t->sparse_list[i].offset = 0;
		t->sparse_list[i].length = archive_entry_size(entry);
	} else {
		t->sparse_list[i].offset = archive_entry_size(entry);
		t->sparse_list[i].length = 0;
	}
	t->current_sparse = t->sparse_list;

	return (ARCHIVE_OK);
}